

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermoIntegrationForceModifier.cpp
# Opt level: O3

void __thiscall
OpenMD::ThermoIntegrationForceModifier::ThermoIntegrationForceModifier
          (ThermoIntegrationForceModifier *this,SimInfo *info)

{
  SimInfo *pSVar1;
  Globals *pGVar2;
  double dVar3;
  double local_18;
  
  RestraintForceModifier::RestraintForceModifier(&this->super_RestraintForceModifier,info);
  (this->super_RestraintForceModifier).super_ForceModifier._vptr_ForceModifier =
       (_func_int **)&PTR__RestraintForceModifier_00300168;
  pSVar1 = (this->super_RestraintForceModifier).super_ForceModifier.info_;
  this->currSnapshot_ = pSVar1->sman_->currentSnapshot_;
  pGVar2 = pSVar1->simParams_;
  this->simParam_ = pGVar2;
  if ((pGVar2->ThermodynamicIntegrationLambda).super_ParameterBase.empty_ == false) {
    local_18 = (pGVar2->ThermodynamicIntegrationLambda).data_;
  }
  else {
    local_18 = 1.0;
    snprintf(painCave.errMsg,2000,
             "ThermoIntegration error: the transformation parameter\n\t(lambda) was not specified. OpenMD will use a default\n\tvalue of %f. To set lambda, use the \n\tthermodynamicIntegrationLambda variable.\n"
            );
    painCave.isFatal = 0;
    simError();
    pGVar2 = this->simParam_;
  }
  if ((pGVar2->ThermodynamicIntegrationK).super_ParameterBase.empty_ == false) {
    dVar3 = (pGVar2->ThermodynamicIntegrationK).data_;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "ThermoIntegration Warning: the tranformation parameter\n\texponent (k) was not specified. OpenMD will use a default\n\tvalue of %f. To set k, use the thermodynamicIntegrationK\n\tvariable.\n"
             ,0x3ff0000000000000);
    painCave.isFatal = 0;
    simError();
    dVar3 = 1.0;
  }
  dVar3 = pow(local_18,dVar3);
  this->factor_ = dVar3;
  return;
}

Assistant:

ThermoIntegrationForceModifier::ThermoIntegrationForceModifier(
      SimInfo* info) :
      RestraintForceModifier {info} {
    currSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    simParam_     = info_->getSimParams();

    RealType tIntLambda, tIntK;

    if (simParam_->haveThermodynamicIntegrationLambda()) {
      tIntLambda = simParam_->getThermodynamicIntegrationLambda();
    } else {
      tIntLambda = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ThermoIntegration error: the transformation parameter\n"
               "\t(lambda) was not specified. OpenMD will use a default\n"
               "\tvalue of %f. To set lambda, use the \n"
               "\tthermodynamicIntegrationLambda variable.\n",
               tIntLambda);
      painCave.isFatal = 0;
      simError();
    }

    if (simParam_->haveThermodynamicIntegrationK()) {
      tIntK = simParam_->getThermodynamicIntegrationK();
    } else {
      tIntK = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ThermoIntegration Warning: the tranformation parameter\n"
               "\texponent (k) was not specified. OpenMD will use a default\n"
               "\tvalue of %f. To set k, use the thermodynamicIntegrationK\n"
               "\tvariable.\n",
               tIntK);
      painCave.isFatal = 0;
      simError();
    }

    // build the scaling factor used to modulate the forces and torques
    factor_ = pow(tIntLambda, tIntK);
  }